

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void kratos::change_var_expr
               (shared_ptr<kratos::Expr> *expr,Var *target,Var *new_var,bool move_linked)

{
  undefined1 this [8];
  Expr *this_00;
  InternalException *this_01;
  ExprOp EVar1;
  pointer ppVar2;
  Var *local_78;
  Var *cond;
  undefined1 local_68 [8];
  shared_ptr<kratos::VarConcat> concat;
  pointer local_38;
  
  if ((target == (Var *)0x0) || (new_var == (Var *)0x0)) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,"Variable is NULL",(allocator<char> *)&stack0xffffffffffffffb8);
    InternalException::InternalException(this_01,(string *)local_68);
    __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (expr->super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (pointer)expr;
  if (this_00->left->type_ == Expression) {
    Var::as<kratos::Expr>((Var *)local_68);
    change_var_expr((shared_ptr<kratos::Expr> *)local_68,target,new_var,move_linked);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&concat);
    this_00 = (Expr *)(local_38->first)._M_dataplus._M_p;
  }
  if ((this_00->right != (Var *)0x0) && (this_00->right->type_ == Expression)) {
    Var::as<kratos::Expr>((Var *)local_68);
    change_var_expr((shared_ptr<kratos::Expr> *)local_68,target,new_var,move_linked);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&concat);
    this_00 = (Expr *)(local_38->first)._M_dataplus._M_p;
  }
  ppVar2 = local_38;
  if (this_00->left == target) {
    this_00->left = new_var;
    if (!move_linked) {
      if (this_00->right == target) {
        this_00->right = new_var;
      }
      goto LAB_0017e969;
    }
    (*(new_var->super_IRNode)._vptr_IRNode[0x14])(new_var,new_var);
    this_00 = (Expr *)(ppVar2->first)._M_dataplus._M_p;
    if (this_00->right != target) goto LAB_0017e969;
    this_00->right = new_var;
  }
  else if ((this_00->right != target) || (this_00->right = new_var, !move_linked))
  goto LAB_0017e969;
  (*(new_var->super_IRNode)._vptr_IRNode[0x14])(new_var,new_var);
  this_00 = (Expr *)(ppVar2->first)._M_dataplus._M_p;
LAB_0017e969:
  if (this_00->left->type_ == Slice) {
    set_slice_var_parent(&this_00->left,target,new_var,false);
    this_00 = (Expr *)(ppVar2->first)._M_dataplus._M_p;
  }
  if ((this_00->right != (Var *)0x0) && (this_00->right->type_ == Slice)) {
    set_slice_var_parent(&this_00->right,target,new_var,false);
    this_00 = (Expr *)(ppVar2->first)._M_dataplus._M_p;
  }
  EVar1 = this_00->op;
  if (EVar1 == Concat) {
    Var::as<kratos::VarConcat>((Var *)local_68);
    this = local_68;
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &target->super_enable_shared_from_this<kratos::Var>);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &new_var->super_enable_shared_from_this<kratos::Var>);
    ppVar2 = local_38;
    VarConcat::replace_var
              ((VarConcat *)this,(shared_ptr<kratos::Var> *)&stack0xffffffffffffffb8,
               (shared_ptr<kratos::Var> *)&stack0xffffffffffffff88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cond);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&concat);
    this_00 = (Expr *)(ppVar2->first)._M_dataplus._M_p;
    EVar1 = this_00->op;
  }
  if (EVar1 == Conditional) {
    Var::as<kratos::ConditionalExpr>((Var *)local_68);
    ppVar2 = local_38;
    local_78 = (Var *)(((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)
                       ((long)local_68 + 0x288))->
                      super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
    if (local_78->type_ == Expression) {
      Var::as<kratos::Expr>((Var *)&stack0xffffffffffffffb8);
      change_var_expr((shared_ptr<kratos::Expr> *)&stack0xffffffffffffffb8,target,new_var,true);
      ppVar2 = local_38;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    }
    else if (local_78 == target) {
      (((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)((long)local_68 + 0x288))->
      super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)new_var;
    }
    else if (local_78->type_ == Slice) {
      set_slice_var_parent(&stack0xffffffffffffff88,target,new_var,false);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&concat);
    this_00 = (Expr *)(ppVar2->first)._M_dataplus._M_p;
  }
  Expr::set_parent(this_00);
  return;
}

Assistant:

void change_var_expr(const std::shared_ptr<Expr> &expr, Var *target, Var *new_var,
                     bool move_linked = true) {
    if (!new_var || !target) throw InternalException("Variable is NULL");
    if (expr->left->type() == VarType::Expression) {
        change_var_expr(expr->left->as<Expr>(), target, new_var, move_linked);
    }
    if (expr->right && expr->right->type() == VarType::Expression) {
        change_var_expr(expr->right->as<Expr>(), target, new_var, move_linked);
    }

    if (expr->left == target) {
        expr->left = new_var;
        if (move_linked) expr->left->move_linked_to(new_var);
    }
    if (expr->right && expr->right == target) {
        expr->right = new_var;
        if (move_linked) expr->right->move_linked_to(new_var);
    }

    // need to change the parent as well
    if (expr->left->type() == VarType::Slice) {
        set_slice_var_parent(expr->left, target, new_var, false);
    }
    if (expr->right && expr->right->type() == VarType::Slice) {
        set_slice_var_parent(expr->right, target, new_var, false);
    }
    // we did some tricks on the concatenation, need to update them there
    if (expr->op == ExprOp::Concat) {
        auto concat = expr->as<VarConcat>();
        concat->replace_var(target->shared_from_this(), new_var->shared_from_this());
    }
    // need to deal with ternary op as well
    if (expr->op == ExprOp::Conditional) {
        auto ternary = expr->as<ConditionalExpr>();
        auto *cond = ternary->condition;
        if (cond->type() == VarType::Expression) {
            change_var_expr(cond->as<Expr>(), target, new_var);
        } else if (cond == target) {
            ternary->condition = new_var;
        } else if (cond->type() == VarType::Slice) {
            set_slice_var_parent(cond, target, new_var, false);
        }
    }
    expr->set_parent();
}